

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statisticspooling.cpp
# Opt level: O0

int __thiscall
ncnn::StatisticsPooling::forward(StatisticsPooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  __type _Var3;
  double dVar4;
  int i_1;
  float std;
  float *ptr_1;
  int q_1;
  int i;
  float mean;
  float *ptr;
  int q;
  int out_channels;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  Allocator *in_stack_fffffffffffffed8;
  Mat *this_00;
  size_t in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  Mat *in_stack_fffffffffffffef0;
  Mat *in_stack_fffffffffffffef8;
  int local_100;
  float local_fc;
  Mat local_f8;
  float *local_b0;
  int local_a8;
  int local_a4;
  float local_a0;
  Mat local_90;
  Mat *local_48;
  int local_40;
  int local_3c;
  undefined8 local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Mat *local_18;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RSI + 0x38);
  local_30 = local_24 * local_28;
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = local_2c;
  if (*(int *)(in_RDI + 0xd0) != 0) {
    local_3c = local_2c << 1;
  }
  local_18 = in_RDX;
  ncnn::Mat::create(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffed8);
  for (local_40 = 0; local_40 < local_2c; local_40 = local_40 + 1) {
    in_stack_fffffffffffffef0 = &local_90;
    ncnn::Mat::channel(in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    in_stack_fffffffffffffef8 = (Mat *)ncnn::Mat::operator_cast_to_float_(in_stack_fffffffffffffef0)
    ;
    ncnn::Mat::~Mat((Mat *)0x9026bc);
    local_a0 = 0.0;
    for (local_a4 = 0; local_a4 < local_30; local_a4 = local_a4 + 1) {
      local_a0 = *(float *)((long)&in_stack_fffffffffffffef8->data + (long)local_a4 * 4) + local_a0;
    }
    fVar2 = (local_a0 / (float)local_24) / (float)local_28;
    local_48 = in_stack_fffffffffffffef8;
    pfVar1 = ncnn::Mat::operator[](local_18,(long)local_40);
    *pfVar1 = fVar2;
  }
  for (local_a8 = local_2c; local_a8 < local_3c; local_a8 = local_a8 + 1) {
    this_00 = &local_f8;
    ncnn::Mat::channel(in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    pfVar1 = ncnn::Mat::operator_cast_to_float_(this_00);
    ncnn::Mat::~Mat((Mat *)0x902812);
    local_fc = 0.0;
    local_b0 = pfVar1;
    for (local_100 = 0; local_100 < local_30; local_100 = local_100 + 1) {
      ncnn::Mat::operator[](local_18,(long)(local_a8 - local_2c));
      _Var3 = ::std::pow<float,int>(0.0,0x90288b);
      local_fc = (float)((double)local_fc + _Var3);
    }
    dVar4 = ::std::sqrt((double)(ulong)(uint)((local_fc / (float)local_24) / (float)local_28));
    pfVar1 = ncnn::Mat::operator[](local_18,(long)local_a8);
    *pfVar1 = SUB84(dVar4,0);
  }
  return 0;
}

Assistant:

int StatisticsPooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;
    size_t elemsize = bottom_blob.elemsize;

    int out_channels = channels;
    if (include_stddev)
    {
        out_channels *= 2;
    }

    top_blob.create(out_channels, elemsize, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float mean = 0.f;
        for (int i = 0; i < size; i++)
        {
            mean += ptr[i];
        }
        top_blob[q] = mean / w / h;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = channels; q < out_channels; q++)
    {
        const float* ptr = bottom_blob.channel(q - channels);

        float std = 0.f;
        for (int i = 0; i < size; i++)
        {
            std += pow((ptr[i] - top_blob[q - channels]), 2);
        }
        top_blob[q] = sqrt(std / w / h);
    }

    return 0;
}